

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int choose_format(archive_read *a)

{
  int iVar1;
  archive *in_RDI;
  int best_bid_slot;
  int best_bid;
  int bid;
  int i;
  int slots;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  int local_18;
  int local_4;
  
  iVar2 = -1;
  local_4 = -1;
  in_RDI[0x15].archive_format_name = (char *)&in_RDI[8].error_string.length;
  local_18 = 0;
  do {
    if (0xf < local_18) {
      if (local_4 < 0) {
        archive_set_error(in_RDI,0x54,"No formats registered");
        local_4 = -0x1e;
      }
      else if (iVar2 < 1) {
        archive_set_error(in_RDI,0x54,"Unrecognized archive format");
        local_4 = -0x1e;
      }
      return local_4;
    }
    if (*(long *)(in_RDI[0x15].archive_format_name + 0x10) != 0) {
      iVar1 = (**(code **)(in_RDI[0x15].archive_format_name + 0x10))(in_RDI,iVar2);
      if (iVar1 == -0x1e) {
        return -0x1e;
      }
      if (*(long *)in_RDI[8].compression_name != 0) {
        __archive_read_seek((archive_read *)CONCAT44(iVar1,iVar2),
                            CONCAT44(local_4,in_stack_ffffffffffffffd8),0);
      }
      if ((iVar2 < iVar1) || (local_4 < 0)) {
        local_4 = local_18;
        iVar2 = iVar1;
      }
    }
    local_18 = local_18 + 1;
    in_RDI[0x15].archive_format_name = in_RDI[0x15].archive_format_name + 0x58;
  } while( true );
}

Assistant:

static int
choose_format(struct archive_read *a)
{
	int slots;
	int i;
	int bid, best_bid;
	int best_bid_slot;

	slots = sizeof(a->formats) / sizeof(a->formats[0]);
	best_bid = -1;
	best_bid_slot = -1;

	/* Set up a->format for convenience of bidders. */
	a->format = &(a->formats[0]);
	for (i = 0; i < slots; i++, a->format++) {
		if (a->format->bid) {
			bid = (a->format->bid)(a, best_bid);
			if (bid == ARCHIVE_FATAL)
				return (ARCHIVE_FATAL);
			if (a->filter->position != 0)
				__archive_read_seek(a, 0, SEEK_SET);
			if ((bid > best_bid) || (best_bid_slot < 0)) {
				best_bid = bid;
				best_bid_slot = i;
			}
		}
	}

	/*
	 * There were no bidders; this is a serious programmer error
	 * and demands a quick and definitive abort.
	 */
	if (best_bid_slot < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "No formats registered");
		return (ARCHIVE_FATAL);
	}

	/*
	 * There were bidders, but no non-zero bids; this means we
	 * can't support this stream.
	 */
	if (best_bid < 1) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unrecognized archive format");
		return (ARCHIVE_FATAL);
	}

	return (best_bid_slot);
}